

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sign.c
# Opt level: O0

int wally_ec_sig_from_der(uchar *bytes,size_t bytes_len,uchar *bytes_out,size_t len)

{
  secp256k1_context *ctx_00;
  int iVar1;
  bool bVar2;
  _Bool ok;
  secp256k1_context *ctx;
  secp256k1_ecdsa_signature sig_secp;
  size_t len_local;
  uchar *bytes_out_local;
  size_t bytes_len_local;
  uchar *bytes_local;
  
  ctx_00 = secp256k1_context_no_precomp;
  bVar2 = false;
  sig_secp.data._56_8_ = len;
  if ((((bytes != (uchar *)0x0) && (bVar2 = false, bytes_len != 0)) &&
      (bVar2 = false, bytes_out != (uchar *)0x0)) && (bVar2 = false, len == 0x40)) {
    iVar1 = secp256k1_ecdsa_signature_parse_der
                      (secp256k1_context_no_precomp,(secp256k1_ecdsa_signature *)&ctx,bytes,
                       bytes_len);
    bVar2 = false;
    if (iVar1 != 0) {
      iVar1 = secp256k1_ecdsa_signature_serialize_compact
                        (ctx_00,bytes_out,(secp256k1_ecdsa_signature *)&ctx);
      bVar2 = iVar1 != 0;
    }
  }
  if ((!bVar2) && (bytes_out != (uchar *)0x0)) {
    wally_clear(bytes_out,sig_secp.data._56_8_);
  }
  wally_clear(&ctx,0x40);
  iVar1 = -2;
  if (bVar2) {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int wally_ec_sig_from_der(const unsigned char *bytes, size_t bytes_len,
                          unsigned char *bytes_out, size_t len)
{
    secp256k1_ecdsa_signature sig_secp;
    const secp256k1_context *ctx = secp256k1_context_no_precomp;
    bool ok;

    ok = bytes && bytes_len && bytes_out && len == EC_SIGNATURE_LEN &&
         secp256k1_ecdsa_signature_parse_der(ctx, &sig_secp, bytes, bytes_len) &&
         secp256k1_ecdsa_signature_serialize_compact(ctx, bytes_out, &sig_secp);

    if (!ok && bytes_out)
        wally_clear(bytes_out, len);
    wally_clear(&sig_secp, sizeof(sig_secp));
    return ok ? WALLY_OK : WALLY_EINVAL;
}